

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O0

bool __thiscall test_CECoordinates::test_ConvertTo(test_CECoordinates *this)

{
  byte bVar1;
  double *in_RDI;
  CECoordinates test_obs;
  CECoordinates test_gal;
  CECoordinates test_cirs;
  CECoordinates test_icrs;
  CEDate date;
  CEObserver observer;
  CEObserver *pCVar2;
  undefined8 in_stack_fffffffffffffd10;
  CEDateType date_format;
  double *pdVar3;
  double in_stack_fffffffffffffd18;
  allocator *paVar4;
  CEDate *in_stack_fffffffffffffd20;
  CEAngleType *in_stack_fffffffffffffd30;
  double *in_stack_fffffffffffffd38;
  double *in_stack_fffffffffffffd40;
  undefined4 local_2a8;
  allocator local_2a1;
  string local_2a0 [32];
  undefined1 local_280 [48];
  undefined4 local_250;
  allocator local_249;
  string local_248 [32];
  undefined1 local_228 [8];
  CEDate *in_stack_fffffffffffffde0;
  CEObserver *in_stack_fffffffffffffde8;
  CECoordinateType in_stack_fffffffffffffdf4;
  CECoordinates *in_stack_fffffffffffffdf8;
  undefined4 local_1f8;
  allocator local_1f1;
  string local_1f0 [32];
  undefined1 local_1d0 [48];
  undefined4 local_1a0;
  allocator local_199;
  string local_198 [32];
  undefined1 local_178 [112];
  double local_108;
  double local_100;
  double local_f8 [3];
  double local_e0;
  undefined4 local_d4;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  CEObserver local_b8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = 0;
  local_d4 = 0;
  pCVar2 = &local_b8;
  CEObserver::CEObserver
            (pCVar2,in_RDI,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd30);
  local_e0 = 0.0;
  CEObserver::SetTemperature_C(pCVar2,&local_e0);
  local_f8[0] = 0.0;
  CEObserver::SetPressure_hPa(&local_b8,local_f8);
  local_100 = 0.0;
  CEObserver::SetWavelength_um(&local_b8,&local_100);
  local_108 = 0.0;
  CEObserver::SetRelativeHumidity(&local_b8,&local_108);
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,date_format);
  CECoordinates::ConvertTo
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,
             in_stack_fffffffffffffde0);
  pdVar3 = in_RDI + 0x4a;
  paVar4 = &local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"test_ConvertTo",paVar4);
  local_1a0 = 0x24e;
  (**(code **)((long)*in_RDI + 200))(in_RDI,local_178,pdVar3,local_198,&local_1a0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  CECoordinates::ConvertTo
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,
             in_stack_fffffffffffffde0);
  pdVar3 = in_RDI + 0x44;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"test_ConvertTo",&local_1f1);
  local_1f8 = 0x251;
  (**(code **)((long)*in_RDI + 200))(in_RDI,local_1d0,pdVar3,local_1f0,&local_1f8);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  CECoordinates::ConvertTo
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,
             in_stack_fffffffffffffde0);
  pdVar3 = in_RDI + 0x50;
  paVar4 = &local_249;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"test_ConvertTo",paVar4);
  local_250 = 0x254;
  (**(code **)((long)*in_RDI + 200))(in_RDI,local_228,pdVar3,local_248,&local_250);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  CECoordinates::ConvertTo
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,
             in_stack_fffffffffffffde0);
  pCVar2 = (CEObserver *)(in_RDI + 0x56);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"test_ConvertTo",&local_2a1);
  local_2a8 = 599;
  (**(code **)((long)*in_RDI + 200))(in_RDI,local_280,pCVar2,local_2a0,&local_2a8);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  bVar1 = (**(code **)((long)*in_RDI + 0x18))();
  CECoordinates::~CECoordinates((CECoordinates *)pCVar2);
  CECoordinates::~CECoordinates((CECoordinates *)pCVar2);
  CECoordinates::~CECoordinates((CECoordinates *)pCVar2);
  CECoordinates::~CECoordinates((CECoordinates *)pCVar2);
  CEDate::~CEDate((CEDate *)0x12647f);
  CEObserver::~CEObserver(pCVar2);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CECoordinates::test_ConvertTo(void)
{
    // Create an observer object
    CEObserver observer(0.0, 0.0, 0.0, CEAngleType::DEGREES);
    observer.SetTemperature_C(0.0);
    observer.SetPressure_hPa(0.0);
    observer.SetWavelength_um(0.0);
    observer.SetRelativeHumidity(0.0);

    // Create a date object
    CEDate date(CppEphem::julian_date_J2000(), CEDateType::JD);

    /* ---------------------------*
     * ConvertTo basic form
     * ---------------------------*/
    CECoordinates test_icrs = base_icrs_.ConvertTo(CECoordinateType::ICRS,
                                                   observer, date);
    test_coords(test_icrs, base_icrs_, __func__, __LINE__);
    CECoordinates test_cirs = base_icrs_.ConvertTo(CECoordinateType::CIRS,
                                                   observer, date);
    test_coords(test_cirs, base_cirs_, __func__, __LINE__);
    CECoordinates test_gal = base_icrs_.ConvertTo(CECoordinateType::GALACTIC,
                                                  observer, date);
    test_coords(test_gal, base_gal_, __func__, __LINE__);
    CECoordinates test_obs = base_icrs_.ConvertTo(CECoordinateType::OBSERVED,
                                                  observer, date);
    test_coords(test_obs, base_obs_, __func__, __LINE__);

    return pass();
}